

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::LoadableStateIncrement
          (ChElementBeamANCF_3333 *this,uint off_x,ChState *x_new,ChState *x,uint off_v,
          ChStateDelta *Dv)

{
  element_type *peVar1;
  
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->super_ChNodeFEAxyzD + 0xa8))();
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzD + 0xa8))(peVar1,off_x + 9,x_new,x,off_v + 9,Dv)
  ;
  peVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyzD + 0xa8))
            (peVar1,off_x + 0x12,x_new,x,off_v + 0x12,Dv);
  return;
}

Assistant:

void ChElementBeamANCF_3333::LoadableStateIncrement(const unsigned int off_x,
                                                    ChState& x_new,
                                                    const ChState& x,
                                                    const unsigned int off_v,
                                                    const ChStateDelta& Dv) {
    m_nodes[0]->NodeIntStateIncrement(off_x, x_new, x, off_v, Dv);
    m_nodes[1]->NodeIntStateIncrement(off_x + 9, x_new, x, off_v + 9, Dv);
    m_nodes[2]->NodeIntStateIncrement(off_x + 18, x_new, x, off_v + 18, Dv);
}